

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask1_32(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  
  auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in + 1));
  auVar7 = vpsllvd_avx512f(auVar7,_DAT_001a4540);
  auVar5 = vpsllvd_avx2(*(undefined1 (*) [32])(in + 0x11),_DAT_001914a0);
  auVar4 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 0x19),_DAT_001949b0);
  auVar6 = vextracti64x4_avx512f(auVar7,1);
  auVar7 = vpord_avx512f(auVar7,ZEXT3264(auVar6));
  auVar1 = vpor_avx(auVar7._0_16_,auVar7._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpor_avx(auVar5._0_16_,auVar5._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpor_avx(auVar2,auVar3);
  auVar3 = vpshufd_avx(auVar2,0x55);
  auVar2 = vpor_avx(auVar2,auVar3);
  auVar3 = vpshufd_avx(auVar4,0xee);
  auVar3 = vpor_avx(auVar4,auVar3);
  auVar4 = vpshufd_avx(auVar3,0x55);
  auVar3 = vpor_avx(auVar3,auVar4);
  *out = auVar3._0_4_ | auVar2._0_4_ | in[0x1d] << 0x1d | auVar1._0_4_ |
         in[0x1f] << 0x1f | in[0x1e] << 0x1e | *in;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_32(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 23;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 26;
  ++in;
  *out |= ((*in)) << 27;
  ++in;
  *out |= ((*in)) << 28;
  ++in;
  *out |= ((*in)) << 29;
  ++in;
  *out |= ((*in)) << 30;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  ++in;

  return out;
}